

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

double __thiscall Polynomial::exp(Polynomial *this,double __x)

{
  int iVar1;
  int in_EDX;
  
  if (0 < in_EDX) {
    iVar1 = in_EDX + 1;
    do {
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  return __x;
}

Assistant:

int Polynomial::exp(int base, int exponent)
{
  // Only handles exponents >= 0
  int val = 1;
  while (exponent > 0)
    {
      while (exponent & 1 == 0)
        {
          exponent >>= 1;
          long sqbase = base * base;
          base = sqbase % mNumStates;
        }
      exponent--;
      long bigval = val * base;
      val = bigval % mNumStates;
    }
  return val;
}